

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_node __thiscall
pugi::xml_node::find_child_by_attribute
          (xml_node *this,char_t *name_,char_t *attr_name,char_t *attr_value)

{
  xml_node_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  bool bVar3;
  xml_node_struct **ppxVar4;
  xml_attribute_struct **ppxVar5;
  char_t *dst;
  
  if (this->_root != (xml_node_struct *)0x0) {
    ppxVar4 = &this->_root->first_child;
    while (pxVar1 = *ppxVar4, pxVar1 != (xml_node_struct *)0x0) {
      if ((pxVar1->name != (char_t *)0x0) &&
         (bVar3 = impl::anon_unknown_0::strequal(name_,pxVar1->name), bVar3)) {
        ppxVar5 = &pxVar1->first_attribute;
        while (pxVar2 = *ppxVar5, pxVar2 != (xml_attribute_struct *)0x0) {
          if ((pxVar2->name != (char_t *)0x0) &&
             (bVar3 = impl::anon_unknown_0::strequal(attr_name,pxVar2->name), bVar3)) {
            dst = pxVar2->value;
            if (dst == (char_t *)0x0) {
              dst = "";
            }
            bVar3 = impl::anon_unknown_0::strequal(attr_value,dst);
            if (bVar3) {
              return (xml_node)pxVar1;
            }
          }
          ppxVar5 = &pxVar2->next_attribute;
        }
      }
      ppxVar4 = &pxVar1->next_sibling;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::find_child_by_attribute(const char_t* name_, const char_t* attr_name, const char_t* attr_value) const
	{
		if (!_root) return xml_node();

		for (xml_node_struct* i = _root->first_child; i; i = i->next_sibling)
			if (i->name && impl::strequal(name_, i->name))
			{
				for (xml_attribute_struct* a = i->first_attribute; a; a = a->next_attribute)
					if (a->name && impl::strequal(attr_name, a->name) && impl::strequal(attr_value, a->value ? a->value + 0 : PUGIXML_TEXT("")))
						return xml_node(i);
			}

		return xml_node();
	}